

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O1

void tlx::die_with_message(char *msg,char *file,size_t line)

{
  size_t sVar1;
  ostream *poVar2;
  undefined8 extraout_RAX;
  ostringstream oss;
  undefined1 auStack_1b8 [8];
  string local_1b0;
  long local_190 [14];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  if (msg == (char *)0x0) {
    std::ios::clear((int)auStack_1b8 + (int)*(undefined8 *)(local_190[0] + -0x18) + 0x28);
  }
  else {
    sVar1 = strlen(msg);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,msg,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," @ ",3);
  if (file == (char *)0x0) {
    std::ios::clear((int)auStack_1b8 + (int)*(undefined8 *)(local_190[0] + -0x18) + 0x28);
  }
  else {
    sVar1 = strlen(file);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,file,sVar1);
  }
  local_1b0._M_dataplus._M_p._0_1_ = 0x3a;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(char *)&local_1b0,1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__cxx11::stringbuf::str();
  die_with_message(&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1b0._M_dataplus._M_p._1_7_,local_1b0._M_dataplus._M_p._0_1_) !=
      &local_1b0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1b0._M_dataplus._M_p._1_7_,local_1b0._M_dataplus._M_p._0_1_),
                    local_1b0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void die_with_message(const char* msg, const char* file, size_t line) {
    std::ostringstream oss;
    oss << msg << " @ " << file << ':' << line;
    die_with_message(oss.str());
}